

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O2

ssize_t archive_write_mtree_data(archive_write *a,void *buff,size_t n)

{
  long *plVar1;
  ulong uVar2;
  uint uVar3;
  size_t sVar4;
  
  plVar1 = (long *)a->format_data;
  uVar2 = plVar1[0xf];
  if (uVar2 < n) {
    n = uVar2;
  }
  plVar1[0xf] = uVar2 - n;
  if ((*plVar1 != 0) && (*(int *)(*plVar1 + 0xe4) == 0x8000)) {
    uVar3 = *(uint *)(plVar1 + 0x1c);
    if ((uVar3 & 1) != 0) {
      for (sVar4 = 0; n != sVar4; sVar4 = sVar4 + 1) {
        *(uint *)((long)plVar1 + 0xe4) =
             *(uint *)((long)plVar1 + 0xe4) << 8 ^
             crctab[(uint)*(byte *)((long)buff + sVar4) ^ *(uint *)((long)plVar1 + 0xe4) >> 0x18];
      }
      plVar1[0x1d] = plVar1[0x1d] + n;
    }
    if ((uVar3 >> 8 & 1) != 0) {
      __archive_openssl_md5update((archive_md5_ctx *)(plVar1 + 0x1e),buff,n);
      uVar3 = *(uint *)(plVar1 + 0x1c);
    }
    if ((uVar3 >> 0xd & 1) != 0) {
      __archive_openssl_ripemd160update((archive_rmd160_ctx *)(plVar1 + 0x1f),buff,n);
      uVar3 = *(uint *)(plVar1 + 0x1c);
    }
    if ((uVar3 >> 0xe & 1) != 0) {
      __archive_openssl_sha1update((archive_sha1_ctx *)(plVar1 + 0x20),buff,n);
      uVar3 = *(uint *)(plVar1 + 0x1c);
    }
    if ((uVar3 >> 0x17 & 1) != 0) {
      __archive_openssl_sha256update((archive_sha256_ctx *)(plVar1 + 0x21),buff,n);
      uVar3 = *(uint *)(plVar1 + 0x1c);
    }
    if ((uVar3 >> 0x18 & 1) != 0) {
      __archive_openssl_sha384update((archive_sha384_ctx *)(plVar1 + 0x22),buff,n);
      uVar3 = *(uint *)(plVar1 + 0x1c);
    }
    if ((uVar3 >> 0x19 & 1) != 0) {
      __archive_openssl_sha512update((archive_sha512_ctx *)(plVar1 + 0x23),buff,n);
    }
  }
  return n;
}

Assistant:

static ssize_t
archive_write_mtree_data(struct archive_write *a, const void *buff, size_t n)
{
	struct mtree_writer *mtree= a->format_data;

	if (n > mtree->entry_bytes_remaining)
		n = (size_t)mtree->entry_bytes_remaining;
	mtree->entry_bytes_remaining -= n;

	/* We don't need to compute a regular file sum */
	if (mtree->mtree_entry == NULL)
		return (n);

	if (mtree->mtree_entry->filetype == AE_IFREG)
		sum_update(mtree, buff, n);

	return (n);
}